

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O2

ggml_gallocr_t ggml_gallocr_new_n(ggml_backend_buffer_type_t *bufts,int n_bufs)

{
  ggml_backend_buffer_type_t buft;
  ulong uVar1;
  ggml_gallocr_t pgVar2;
  ggml_backend_buffer_type_t *ppgVar3;
  ggml_backend_buffer_t *ppgVar4;
  ggml_dyn_tallocr **ppgVar5;
  ulong uVar6;
  size_t sVar7;
  ggml_dyn_tallocr *pgVar8;
  char *pcVar9;
  size_t __nmemb;
  int line;
  ulong uVar10;
  ulong uVar11;
  
  pgVar2 = (ggml_gallocr_t)calloc(1,0x60);
  if (pgVar2 == (ggml_gallocr_t)0x0) {
    pcVar9 = "galloc != NULL";
    line = 0x17e;
  }
  else {
    __nmemb = (size_t)n_bufs;
    ppgVar3 = (ggml_backend_buffer_type_t *)calloc(__nmemb,8);
    pgVar2->bufts = ppgVar3;
    if (ppgVar3 == (ggml_backend_buffer_type_t *)0x0) {
      pcVar9 = "galloc->bufts != NULL";
      line = 0x181;
    }
    else {
      ppgVar4 = (ggml_backend_buffer_t *)calloc(__nmemb,8);
      pgVar2->buffers = ppgVar4;
      if (ppgVar4 == (ggml_backend_buffer_t *)0x0) {
        pcVar9 = "galloc->buffers != NULL";
        line = 0x184;
      }
      else {
        ppgVar5 = (ggml_dyn_tallocr **)calloc(__nmemb,8);
        pgVar2->buf_tallocs = ppgVar5;
        if (ppgVar5 != (ggml_dyn_tallocr **)0x0) {
          uVar10 = 0;
          uVar11 = 0;
          if (0 < n_bufs) {
            uVar11 = (ulong)(uint)n_bufs;
          }
          do {
            if (uVar10 == uVar11) {
              pgVar2->n_buffers = n_bufs;
              return pgVar2;
            }
            buft = bufts[uVar10];
            ppgVar3[uVar10] = buft;
            ppgVar4[uVar10] = (ggml_backend_buffer_t)0x0;
            uVar1 = 0;
            do {
              uVar6 = uVar1;
              if (uVar10 == uVar6) {
                pgVar8 = ppgVar5[uVar10];
                goto LAB_00128eb9;
              }
              uVar1 = uVar6 + 1;
            } while (buft != bufts[uVar6]);
            pgVar8 = ppgVar5[uVar6];
            ppgVar5[uVar10] = pgVar8;
LAB_00128eb9:
            if (pgVar8 == (ggml_dyn_tallocr *)0x0) {
              sVar7 = ggml_backend_buft_get_alignment(buft);
              pgVar8 = (ggml_dyn_tallocr *)malloc(0x1018);
              pgVar8->alignment = sVar7;
              memset(&pgVar8->n_free_blocks,0,0x1008);
              pgVar8->n_free_blocks = 1;
              pgVar8->free_blocks[0].size = 0x7fffffffffffffff;
              pgVar8->max_size = 0;
              ppgVar5[uVar10] = pgVar8;
            }
            uVar10 = uVar10 + 1;
          } while( true );
        }
        pcVar9 = "galloc->buf_tallocs != NULL";
        line = 0x187;
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c",
             line,"GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

ggml_gallocr_t ggml_gallocr_new_n(ggml_backend_buffer_type_t * bufts, int n_bufs) {
    ggml_gallocr_t galloc = (ggml_gallocr_t)calloc(1, sizeof(struct ggml_gallocr));
    GGML_ASSERT(galloc != NULL);

    galloc->bufts = calloc(n_bufs, sizeof(ggml_backend_buffer_type_t));
    GGML_ASSERT(galloc->bufts != NULL);

    galloc->buffers = calloc(n_bufs, sizeof(ggml_backend_buffer_t));
    GGML_ASSERT(galloc->buffers != NULL);

    galloc->buf_tallocs = calloc(n_bufs, sizeof(struct ggml_dyn_tallocr *));
    GGML_ASSERT(galloc->buf_tallocs != NULL);

    for (int i = 0; i < n_bufs; i++) {
        galloc->bufts[i] = bufts[i];
        galloc->buffers[i] = NULL;

        // check if the same buffer type is used multiple times and reuse the same allocator
        for (int j = 0; j < i; j++) {
            if (bufts[i] == bufts[j]) {
                galloc->buf_tallocs[i] = galloc->buf_tallocs[j];
                break;
            }
        }

        if (galloc->buf_tallocs[i] == NULL) {
            size_t alignment = ggml_backend_buft_get_alignment(bufts[i]);
            galloc->buf_tallocs[i] = ggml_dyn_tallocr_new(alignment);
        }
    }
    galloc->n_buffers = n_bufs;

    return galloc;
}